

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O3

void nhdp_db_link_remove(nhdp_link *lnk)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  oonf_class_event(&_link_info,lnk,OONF_OBJECT_REMOVED);
  oonf_timer_stop(&lnk->sym_time);
  oonf_timer_stop(&lnk->heard_time);
  oonf_timer_stop(&lnk->vtime);
  if (lnk->dualstack_partner != (nhdp_link *)0x0) {
    lnk->dualstack_partner->dualstack_partner = (nhdp_link *)0x0;
    lnk->dualstack_partner = (nhdp_link *)0x0;
  }
  if ((lnk->neigh->originator)._type != '\0') {
    avl_remove(&lnk->local_if->_link_originators,&lnk->_originator_node);
  }
  plVar3 = (lnk->_addresses).list_head.next;
  plVar2 = plVar3->prev;
  while (plVar2 != (lnk->_addresses).list_head.prev) {
    plVar1 = plVar3->next;
    nhdp_db_link_addr_remove((nhdp_laddr *)&plVar3[-3].prev);
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  plVar3 = (lnk->_2hop).list_head.next;
  plVar2 = plVar3->prev;
  while (plVar2 != (lnk->_2hop).list_head.prev) {
    plVar1 = plVar3->next;
    nhdp_db_link_2hop_remove((nhdp_l2hop *)(plVar3 + -8));
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  plVar3 = (lnk->_if_node).next;
  plVar2 = (lnk->_if_node).prev;
  plVar2->next = plVar3;
  plVar3->prev = plVar2;
  lnk->local_if = (nhdp_interface *)0x0;
  (lnk->_if_node).next = (list_entity *)0x0;
  (lnk->_if_node).prev = (list_entity *)0x0;
  plVar3 = (lnk->_neigh_node).next;
  plVar2 = (lnk->_neigh_node).prev;
  plVar2->next = plVar3;
  plVar3->prev = plVar2;
  (lnk->_neigh_node).next = (list_entity *)0x0;
  (lnk->_neigh_node).prev = (list_entity *)0x0;
  plVar3 = (lnk->_global_node).next;
  plVar2 = (lnk->_global_node).prev;
  plVar2->next = plVar3;
  plVar3->prev = plVar2;
  (lnk->_global_node).next = (list_entity *)0x0;
  (lnk->_global_node).prev = (list_entity *)0x0;
  oonf_class_free(&_link_info,lnk);
  return;
}

Assistant:

void
nhdp_db_link_remove(struct nhdp_link *lnk) {
  struct nhdp_laddr *laddr, *la_it;
  struct nhdp_l2hop *twohop, *th_it;

  /* trigger event */
  oonf_class_event(&_link_info, lnk, OONF_OBJECT_REMOVED);

  oonf_timer_stop(&lnk->sym_time);
  oonf_timer_stop(&lnk->heard_time);
  oonf_timer_stop(&lnk->vtime);

  /* disconnect dualstack */
  if (nhdp_db_link_is_dualstack(lnk)) {
    nhdp_db_link_disconnect_dualstack(lnk);
  }

  if (netaddr_get_address_family(&lnk->neigh->originator) != AF_UNSPEC) {
    avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
  }

  /* detach all addresses */
  avl_for_each_element_safe(&lnk->_addresses, laddr, _link_node, la_it) {
    nhdp_db_link_addr_remove(laddr);
  }

  /* remove all 2hop addresses */
  avl_for_each_element_safe(&lnk->_2hop, twohop, _link_node, th_it) {
    nhdp_db_link_2hop_remove(twohop);
  }

  /* unlink */
  nhdp_interface_remove_link(lnk);
  list_remove(&lnk->_neigh_node);

  /* remove from global list */
  list_remove(&lnk->_global_node);

  /* free memory */
  oonf_class_free(&_link_info, lnk);
}